

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O3

void __thiscall slang::ast::SubroutineSymbol::addThisVar(SubroutineSymbol *this,Type *type)

{
  VariableSymbol *member;
  VariableLifetime local_1c;
  
  local_1c = Automatic;
  member = BumpAllocator::
           emplace<slang::ast::VariableSymbol,char_const(&)[5],slang::SourceLocation_const&,slang::ast::VariableLifetime>
                     (&((this->super_Scope).compilation)->super_BumpAllocator,(char (*) [5])"this",
                      &(type->super_Symbol).location,&local_1c);
  (member->super_ValueSymbol).declaredType.type = type;
  *(byte *)&(member->flags).m_bits = (byte)(member->flags).m_bits | 3;
  this->thisVar = member;
  Scope::insertMember(&this->super_Scope,(Symbol *)member,(this->super_Scope).lastMember,false,true)
  ;
  return;
}

Assistant:

void SubroutineSymbol::addThisVar(const Type& type) {
    auto tv = getCompilation().emplace<VariableSymbol>("this", type.location,
                                                       VariableLifetime::Automatic);
    tv->setType(type);
    tv->flags |= VariableFlags::Const | VariableFlags::CompilerGenerated;
    thisVar = tv;
    addMember(*thisVar);
}